

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O0

void __thiscall helics::helicsCLI11App::addSystemInfoCall(helicsCLI11App *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000048;
  function<void_()> *in_stack_00000050;
  string *in_stack_00000058;
  App *in_stack_00000060;
  anon_class_1_0_00000001 *__f;
  function<void_()> *in_stack_ffffffffffffff70;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  anon_class_1_0_00000001 local_29 [41];
  
  __f = local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::function<void()>::function<helics::helicsCLI11App::addSystemInfoCall()::_lambda()_1_,void>
            (in_stack_ffffffffffffff70,__f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  CLI::App::add_flag_callback
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  std::__cxx11::string::~string(in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  CLI::std::function<void_()>::~function((function<void_()> *)0x196e06);
  std::__cxx11::string::~string(in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  return;
}

Assistant:

void addSystemInfoCall()
    {
        add_flag_callback(
            "--system",
            []() {
                std::cout << systemInfo() << std::endl;
                throw CLI::Success{};
            },
            "display system information details");
    }